

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hh
# Opt level: O0

void __thiscall
yy::parser::value_type::move<ArrayAccessExpression*>(value_type *this,self_type *that)

{
  ArrayAccessExpression **u;
  self_type *that_local;
  value_type *this_local;
  
  u = as<ArrayAccessExpression*>(that);
  emplace<ArrayAccessExpression*,ArrayAccessExpression*>(this,u);
  destroy<ArrayAccessExpression*>(that);
  return;
}

Assistant:

void
    move (self_type&& that)
    {
      emplace<T> (std::move (that.as<T> ()));
      that.destroy<T> ();
    }